

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.hpp
# Opt level: O1

void __thiscall ot::commissioner::CommissionerImpl::~CommissionerImpl(CommissionerImpl *this)

{
  RequestHandler *pRVar1;
  pointer pCVar2;
  pointer pRVar3;
  pointer puVar4;
  _Manager_type p_Var5;
  pointer pcVar6;
  
  (this->super_Commissioner)._vptr_Commissioner = (_func_int **)&PTR__CommissionerImpl_002b8da0;
  std::
  vector<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
  ::~vector(&(this->mDiagAnsTlvs).mChildIpv6AddrsInfoList);
  pCVar2 = (this->mDiagAnsTlvs).mChildTable.
           super__Vector_base<ot::commissioner::ChildTableEntry,_std::allocator<ot::commissioner::ChildTableEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pCVar2 != (pointer)0x0) {
    operator_delete(pCVar2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->mDiagAnsTlvs).mAddrs);
  pRVar3 = (this->mDiagAnsTlvs).mRoute64.mRouteData.
           super__Vector_base<ot::commissioner::RouteDataEntry,_std::allocator<ot::commissioner::RouteDataEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pRVar3 != (pointer)0x0) {
    operator_delete(pRVar3);
  }
  puVar4 = (this->mDiagAnsTlvs).mRoute64.mMask.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4);
  }
  puVar4 = (this->mDiagAnsTlvs).mExtMacAddr.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4);
  }
  puVar4 = (this->mDiagAnsTlvs).mEui64.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4);
  }
  p_Var5 = (this->mResourceDiagAns).mHandler.super__Function_base._M_manager;
  if (p_Var5 != (_Manager_type)0x0) {
    pRVar1 = &(this->mResourceDiagAns).mHandler;
    (*p_Var5)((_Any_data *)pRVar1,(_Any_data *)pRVar1,__destroy_functor);
  }
  pcVar6 = (this->mResourceDiagAns).mUriPath._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar6 != &(this->mResourceDiagAns).mUriPath.field_2) {
    operator_delete(pcVar6);
  }
  p_Var5 = (this->mResourceEnergyReport).mHandler.super__Function_base._M_manager;
  if (p_Var5 != (_Manager_type)0x0) {
    pRVar1 = &(this->mResourceEnergyReport).mHandler;
    (*p_Var5)((_Any_data *)pRVar1,(_Any_data *)pRVar1,__destroy_functor);
  }
  pcVar6 = (this->mResourceEnergyReport).mUriPath._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar6 != &(this->mResourceEnergyReport).mUriPath.field_2) {
    operator_delete(pcVar6);
  }
  p_Var5 = (this->mResourcePanIdConflict).mHandler.super__Function_base._M_manager;
  if (p_Var5 != (_Manager_type)0x0) {
    pRVar1 = &(this->mResourcePanIdConflict).mHandler;
    (*p_Var5)((_Any_data *)pRVar1,(_Any_data *)pRVar1,__destroy_functor);
  }
  pcVar6 = (this->mResourcePanIdConflict).mUriPath._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar6 != &(this->mResourcePanIdConflict).mUriPath.field_2) {
    operator_delete(pcVar6);
  }
  p_Var5 = (this->mResourceDatasetChanged).mHandler.super__Function_base._M_manager;
  if (p_Var5 != (_Manager_type)0x0) {
    pRVar1 = &(this->mResourceDatasetChanged).mHandler;
    (*p_Var5)((_Any_data *)pRVar1,(_Any_data *)pRVar1,__destroy_functor);
  }
  pcVar6 = (this->mResourceDatasetChanged).mUriPath._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar6 != &(this->mResourceDatasetChanged).mUriPath.field_2) {
    operator_delete(pcVar6);
  }
  TokenManager::~TokenManager(&this->mTokenManager);
  puVar4 = (this->mProxyClient).mMeshLocalPrefix.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4);
  }
  coap::Coap::~Coap(&(this->mProxyClient).mCoap);
  ProxyEndpoint::~ProxyEndpoint(&(this->mProxyClient).mEndpoint);
  p_Var5 = (this->mResourceRlyRx).mHandler.super__Function_base._M_manager;
  if (p_Var5 != (_Manager_type)0x0) {
    pRVar1 = &(this->mResourceRlyRx).mHandler;
    (*p_Var5)((_Any_data *)pRVar1,(_Any_data *)pRVar1,__destroy_functor);
  }
  pcVar6 = (this->mResourceRlyRx).mUriPath._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar6 != &(this->mResourceRlyRx).mUriPath.field_2) {
    operator_delete(pcVar6);
  }
  p_Var5 = (this->mResourceUdpRx).mHandler.super__Function_base._M_manager;
  if (p_Var5 != (_Manager_type)0x0) {
    pRVar1 = &(this->mResourceUdpRx).mHandler;
    (*p_Var5)((_Any_data *)pRVar1,(_Any_data *)pRVar1,__destroy_functor);
  }
  pcVar6 = (this->mResourceUdpRx).mUriPath._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar6 != &(this->mResourceUdpRx).mUriPath.field_2) {
    operator_delete(pcVar6);
  }
  Timer::~Timer(&this->mJoinerSessionTimer);
  std::
  _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>_>
  ::~_Rb_tree(&(this->mJoinerSessions)._M_t);
  coap::CoapSecure::~CoapSecure(&this->mBrClient);
  Timer::~Timer(&this->mKeepAliveTimer);
  Config::~Config(&this->mConfig);
  return;
}

Assistant:

~CommissionerImpl() override = default;